

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImageGradientLinear
                  (Image *__return_storage_ptr__,int width,int height,int direction,Color start,
                  Color end)

{
  void *pvVar1;
  undefined1 *puVar2;
  ulong uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pvVar1 = malloc((long)(height * width) << 2);
  fVar6 = ((float)(0x5a - direction) / 180.0) * 3.14159;
  fVar7 = cosf(fVar6);
  fVar8 = sinf(fVar6);
  fVar9 = (0.5 - (float)width * fVar7 * 0.5) - (float)height * fVar8 * 0.5;
  fVar6 = fVar9;
  if ((int)((uint)fVar7 ^ (uint)fVar8) < 0) {
    fVar6 = (float)width * fVar7 + fVar9;
  }
  if (0 < width) {
    puVar2 = (undefined1 *)((long)pvVar1 + 3);
    uVar3 = 0;
    do {
      if (0 < height) {
        uVar5 = 0;
        puVar4 = puVar2;
        do {
          fVar10 = ((float)(int)uVar5 * fVar8 + (float)(int)uVar3 * fVar7 + fVar9) / ABS(fVar6);
          fVar11 = 1.0;
          if (fVar10 <= 1.0) {
            fVar11 = fVar10;
          }
          fVar10 = -1.0;
          if (-1.0 <= fVar11) {
            fVar10 = fVar11;
          }
          fVar10 = fVar10 * 0.5 + 0.5;
          fVar11 = 1.0 - fVar10;
          puVar4[-3] = (char)(int)(fVar11 * (float)((uint)start & 0xff) +
                                  fVar10 * (float)((uint)end & 0xff));
          puVar4[-2] = (char)(int)(fVar11 * (float)((uint)start >> 8 & 0xff) +
                                  fVar10 * (float)((uint)end >> 8 & 0xff));
          puVar4[-1] = (char)(int)(fVar11 * (float)((uint)start >> 0x10 & 0xff) +
                                  fVar10 * (float)((uint)end >> 0x10 & 0xff));
          *puVar4 = (char)(int)(fVar11 * (float)((uint)start >> 0x18) +
                               fVar10 * (float)((uint)end >> 0x18));
          uVar5 = uVar5 + 1;
          puVar4 = puVar4 + (ulong)(uint)width * 4;
        } while ((uint)height != uVar5);
      }
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 4;
    } while (uVar3 != (uint)width);
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientLinear(int width, int height, int direction, Color start, Color end)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float radianDirection = (float)(90 - direction)/180.f*3.14159f;
    float cosDir = cosf(radianDirection);
    float sinDir = sinf(radianDirection);

    // Calculate how far the top-left pixel is along the gradient direction from the center of said gradient
    float startingPos = 0.5f - (cosDir*width/2) - (sinDir*height/2);
    // With directions that lie in the first or third quadrant (i.e. from top-left to 
    // bottom-right or vice-versa), pixel (0, 0) is the farthest point on the gradient
    // (i.e. the pixel which should become one of the gradient's ends color); while for
    // directions that lie in the second or fourth quadrant, that point is pixel (width, 0).
    float maxPosValue = 
            ((signbit(sinDir) != 0) == (signbit(cosDir) != 0))
            ? fabsf(startingPos)
            : fabsf(startingPos+width*cosDir);
    for (int i = 0; i < width; i++)
    {
        for (int j = 0; j < height; j++)
        {
            // Calculate the relative position of the pixel along the gradient direction
            float pos = (startingPos + (i*cosDir + j*sinDir)) / maxPosValue;

            float factor = pos;
            factor = (factor > 1.0f)? 1.0f : factor;  // Clamp to [-1,1]
            factor = (factor < -1.0f)? -1.0f : factor;  // Clamp to [-1,1]
            factor = factor / 2 + 0.5f;

            // Generate the color for this pixel
            pixels[j*width + i].r = (int)((float)end.r*factor + (float)start.r*(1.0f - factor));
            pixels[j*width + i].g = (int)((float)end.g*factor + (float)start.g*(1.0f - factor));
            pixels[j*width + i].b = (int)((float)end.b*factor + (float)start.b*(1.0f - factor));
            pixels[j*width + i].a = (int)((float)end.a*factor + (float)start.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}